

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

cram_codec *
cram_byte_array_stop_decode_init(char *data,int size,cram_external_type option,int version)

{
  byte bVar1;
  cram_codec *pcVar2;
  byte *pbVar3;
  uint uVar4;
  uint uVar5;
  code *pcVar6;
  long lVar7;
  
  pcVar2 = (cram_codec *)malloc(0x240);
  if (pcVar2 != (cram_codec *)0x0) {
    pcVar6 = cram_byte_array_stop_decode_char;
    if (option == E_BYTE_ARRAY_BLOCK) {
      pcVar6 = cram_byte_array_stop_decode_block;
    }
    pcVar2->codec = E_BYTE_ARRAY_STOP;
    pcVar2->decode = pcVar6;
    pcVar2->free = cram_byte_array_stop_decode_free;
    (pcVar2->field_6).byte_array_stop.stop = *data;
    if ((version & 0xffffff00U) == 0x100) {
      (pcVar2->field_6).external.type = *(cram_external_type *)(data + 1);
      pbVar3 = (byte *)(data + 5);
    }
    else {
      bVar1 = data[1];
      uVar5 = (uint)bVar1;
      lVar7 = 1;
      if ((char)bVar1 < '\0') {
        uVar4 = (uint)bVar1;
        uVar5 = (uint)(byte)data[2];
        if (bVar1 < 0xc0) {
          uVar5 = (uVar4 & 0x3f) << 8 | uVar5;
          lVar7 = 2;
        }
        else if (bVar1 < 0xe0) {
          uVar5 = (uVar4 & 0x1f) << 0x10 | uVar5 << 8 | (uint)(byte)data[3];
          lVar7 = 3;
        }
        else if (bVar1 < 0xf0) {
          uVar5 = (uVar4 & 0xf) << 0x18 | uVar5 << 0x10 | (uint)(byte)data[3] << 8 |
                  (uint)(byte)data[4];
          lVar7 = 4;
        }
        else {
          uVar5 = (byte)data[5] & 0xf |
                  (uint)(byte)data[4] << 4 |
                  (uint)(byte)data[3] << 0xc | uVar5 << 0x14 | uVar4 << 0x1c;
          lVar7 = 5;
        }
      }
      *(uint *)((long)&pcVar2->field_6 + 4) = uVar5;
      pbVar3 = (byte *)(data + 1 + lVar7);
    }
    if ((long)pbVar3 - (long)data == (long)size) {
      return pcVar2;
    }
    cram_byte_array_stop_decode_init_cold_1();
  }
  return (cram_codec *)0x0;
}

Assistant:

cram_codec *cram_byte_array_stop_decode_init(char *data, int size,
					     enum cram_external_type option,
					     int version) {
    cram_codec *c;
    unsigned char *cp = (unsigned char *)data;

    if (!(c = malloc(sizeof(*c))))
	return NULL;

    c->codec  = E_BYTE_ARRAY_STOP;
    c->decode = (option == E_BYTE_ARRAY_BLOCK)
	? cram_byte_array_stop_decode_block
	: cram_byte_array_stop_decode_char;
    c->free   = cram_byte_array_stop_decode_free;
    
    c->byte_array_stop.stop = *cp++;
    if (CRAM_MAJOR_VERS(version) == 1) {
	c->byte_array_stop.content_id = cp[0] + (cp[1]<<8) + (cp[2]<<16)
	    + (cp[3]<<24);
	cp += 4;
    } else {
	cp += itf8_get(cp, &c->byte_array_stop.content_id);
    }

    if ((char *)cp - data != size) {
	fprintf(stderr, "Malformed byte_array_stop header stream\n");
	free(c);
	return NULL;
    }

    return c;
}